

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O1

Quat4f __thiscall Quat4f::lerp(Quat4f *this,Quat4f *q0,Quat4f *q1,float alpha)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Quat4f *q;
  undefined8 extraout_XMM0_Qa;
  float fVar7;
  Quat4f QVar9;
  ulong uVar8;
  
  fVar1 = q1->m_elements[1];
  fVar2 = q0->m_elements[1];
  fVar3 = q1->m_elements[2];
  fVar4 = q0->m_elements[2];
  fVar5 = q1->m_elements[3];
  fVar6 = q0->m_elements[3];
  fVar7 = (q1->m_elements[0] - q0->m_elements[0]) * alpha + q0->m_elements[0];
  uVar8 = (ulong)(uint)fVar7;
  this->m_elements[0] = fVar7;
  this->m_elements[1] = (fVar1 - fVar2) * alpha + fVar2;
  this->m_elements[2] = (fVar3 - fVar4) * alpha + fVar4;
  this->m_elements[3] = (fVar5 - fVar6) * alpha + fVar6;
  normalize(this);
  QVar9.m_elements[2] = (float)(int)uVar8;
  QVar9.m_elements[3] = (float)(int)(uVar8 >> 0x20);
  QVar9.m_elements[0] = (float)(int)extraout_XMM0_Qa;
  QVar9.m_elements[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Quat4f)QVar9.m_elements;
}

Assistant:

Quat4f Quat4f::lerp( const Quat4f& q0, const Quat4f& q1, float alpha )
{
	return( ( q0 + alpha * ( q1 - q0 ) ).normalized() );
}